

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O3

void __thiscall compress::CompressAstar<Tiles>::CompressAstar(CompressAstar<Tiles> *this,Tiles *d)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_SearchAlg<Tiles>).dom = d;
  (this->super_SearchAlg<Tiles>).expd = 0;
  (this->super_SearchAlg<Tiles>).gend = 0;
  (this->super_SearchAlg<Tiles>)._vptr_SearchAlg = (_func_int **)&PTR_search_00119960;
  CompressClosedList<Node<Tiles>_>::CompressClosedList(&this->closed,true,true,true,0x3b600000);
  p_Var1 = &(this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->open).fg_buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mkdir("open_list_buckets",0x1e4);
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

CompressAstar(D &d) : SearchAlg<D>(d),
            closed(true, true, true, 950_MiB), // TODO: move to user option
            open() { }